

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo_approach.cpp
# Opt level: O2

vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *
histogram_approach(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                   *__return_storage_ptr__,Mat *img)

{
  size_t *psVar1;
  uint uVar2;
  pointer plVar3;
  pointer plVar4;
  long lVar5;
  long lVar6;
  pointer plVar7;
  ulong uVar8;
  ulong uVar9;
  pointer plVar10;
  pointer plVar11;
  ulong uVar12;
  pointer plVar13;
  int iVar14;
  bool bVar15;
  vector<line_bound,_std::allocator<line_bound>_> horz_histo;
  line_bound local_a8;
  array<int,_4UL> local_90 [6];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"img",(allocator<char> *)&horz_histo);
  cv::namedWindow((string *)local_90,0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"img",(allocator<char> *)&local_a8);
  horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
  horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)img;
  cv::imshow((string *)local_90,(_InputArray *)&horz_histo);
  std::__cxx11::string::~string((string *)local_90);
  uVar9 = 0;
  cv::waitKey(0);
  cv::destroyAllWindows();
  uVar2 = *(uint *)(img + 8);
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<line_bound,_std::allocator<line_bound>_>::resize(&horz_histo,(long)(int)uVar2);
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar9;
  }
  for (uVar12 = 0;
      plVar3 = horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
               super__Vector_impl_data._M_start, uVar8 != uVar12; uVar12 = uVar12 + 1) {
    cv::Mat::row((Mat *)local_90,(int)img);
    find_longest_line(&local_a8,(Mat *)local_90);
    *(size_t *)
     ((long)&(horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
              super__Vector_impl_data._M_start)->size + uVar9) = local_a8.size;
    psVar1 = (size_t *)
             ((long)&(horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl
                      .super__Vector_impl_data._M_start)->ibegin + uVar9);
    *psVar1 = local_a8.ibegin;
    psVar1[1] = local_a8.iend;
    cv::Mat::~Mat((Mat *)local_90);
    uVar9 = uVar9 + 0x18;
  }
  plVar4 = horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
       super__Vector_impl_data._M_start !=
       horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (plVar13 = horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
                super__Vector_impl_data._M_start + 1,
     plVar13 !=
     horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    plVar4 = plVar13;
    plVar7 = horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar11 = horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
        super__Vector_impl_data._M_start[1].size <
        (horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
         super__Vector_impl_data._M_start)->size) {
      plVar4 = horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar7 = plVar13;
    }
    while (plVar13 = plVar11 + 2,
          plVar13 !=
          horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
          super__Vector_impl_data._M_finish) {
      plVar10 = plVar11 + 3;
      if (plVar10 ==
          horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if ((plVar7->size <= plVar11[2].size) && (plVar4->size <= plVar11[2].size)) {
          plVar4 = plVar13;
        }
        break;
      }
      uVar8 = plVar11[2].size;
      uVar9 = plVar11[3].size;
      bVar15 = uVar9 < uVar8;
      plVar11 = plVar13;
      uVar12 = uVar8;
      if (bVar15) {
        plVar11 = plVar10;
        uVar12 = uVar9;
      }
      if (!bVar15 && uVar9 != uVar8) {
        uVar8 = uVar9;
      }
      if (bVar15) {
        plVar10 = plVar13;
      }
      if (plVar7->size <= uVar12) {
        plVar11 = plVar7;
      }
      plVar7 = plVar11;
      plVar11 = plVar13;
      if (plVar4->size <= uVar8) {
        plVar4 = plVar10;
      }
    }
  }
  uVar8 = plVar4->size;
  lVar6 = (long)horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
                super__Vector_impl_data._M_start;
  plVar4 = horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
           super__Vector_impl_data._M_start + 2;
  for (lVar5 = lVar6 / 0x18 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (uVar8 <= plVar4[-2].size) {
      plVar13 = plVar4 + -2;
      goto LAB_00117a1e;
    }
    if (uVar8 <= plVar4[-1].size) {
      plVar13 = plVar4 + -1;
      goto LAB_00117a1e;
    }
    plVar13 = plVar4;
    if (uVar8 <= plVar4->size) goto LAB_00117a1e;
    if (uVar8 <= plVar4[1].size) {
      plVar13 = plVar4 + 1;
      goto LAB_00117a1e;
    }
    plVar4 = plVar4 + 4;
    lVar6 = lVar6 + -0x60;
  }
  lVar6 = lVar6 / 0x18;
  plVar11 = plVar4 + -2;
  if (lVar6 != 1) {
    if (lVar6 == 3) {
      plVar13 = plVar11;
      if (uVar8 <= plVar4[-2].size) goto LAB_00117a1e;
      plVar11 = plVar4 + -1;
    }
    else {
      plVar13 = horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (lVar6 != 2) goto LAB_00117a1e;
    }
    plVar13 = plVar11;
    if (uVar8 <= plVar11->size) goto LAB_00117a1e;
    plVar11 = plVar11 + 1;
  }
  plVar13 = plVar11;
  if (plVar11->size < uVar8) {
    plVar13 = horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
LAB_00117a1e:
  plVar13->ibegin = 0;
  local_90[0]._M_elems[0] = 0;
  local_90[0]._M_elems[1] = 0;
  local_90[0]._M_elems[2] = (int)plVar13->iend;
  local_90[0]._M_elems[3] = 0;
  std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
  emplace_back<std::array<int,4ul>>
            ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
             __return_storage_ptr__,local_90);
  local_90[0]._M_elems[2] = (int)plVar13->ibegin;
  local_90[0]._M_elems[1] = 0;
  local_90[0]._M_elems[0] = local_90[0]._M_elems[2];
  iVar14 = (int)uVar8 + (int)(((long)plVar13 - (long)plVar3) / 0x18);
  local_90[0]._M_elems[3] = iVar14;
  std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
  emplace_back<std::array<int,4ul>>
            ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
             __return_storage_ptr__,local_90);
  local_90[0]._M_elems[2] = (int)plVar13->iend;
  local_90[0]._M_elems[1] = 0;
  local_90[0]._M_elems[0] = local_90[0]._M_elems[2];
  local_90[0]._M_elems[3] = iVar14;
  std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
  emplace_back<std::array<int,4ul>>
            ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
             __return_storage_ptr__,local_90);
  local_90[0]._M_elems[1] = iVar14;
  local_90[0]._M_elems[0] = (int)plVar13->ibegin;
  local_90[0]._M_elems[2] = (int)plVar13->iend;
  local_90[0]._M_elems[3] = iVar14;
  std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
  emplace_back<std::array<int,4ul>>
            ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
             __return_storage_ptr__,local_90);
  std::_Vector_base<line_bound,_std::allocator<line_bound>_>::~_Vector_base
            (&horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<int, 4>> histogram_approach(const cv::Mat& img)
{
    cv::namedWindow("img", cv::WINDOW_NORMAL);
    cv::imshow("img", img);
    cv::waitKey(0);
    cv::destroyAllWindows();

    const int row_size = img.rows;
    std::vector<std::array<int, 4>> result;

    std::vector<line_bound> horz_histo;
    horz_histo.resize(row_size);

    for(int i = 0; i < row_size; i++)
    {
        horz_histo[i] = find_longest_line(img.row(i));
    }

    auto minmax = std::minmax_element(horz_histo.begin(), horz_histo.end(),
        [](const line_bound& lval, const line_bound& rval) { return lval.size < rval.size; });

    auto upper_threshold = minmax.second->size;

    auto upper_b = std::find_if(horz_histo.begin(), horz_histo.end(),
        [upper_threshold](const line_bound& v) { return v.size >= upper_threshold; });

    std::size_t upper_i = std::distance(horz_histo.begin(), upper_b);
    std::size_t lower_i = upper_i + minmax.second->size;
    upper_i *= static_cast<std::size_t>(0.95);
    lower_i *= static_cast<std::size_t>(1.05);
    upper_b->ibegin *= static_cast<std::size_t>(0.95);
    upper_b->iend *= static_cast<std::size_t>(1.05);

    result.push_back({int(upper_b->ibegin), int(upper_i), int(upper_b->iend), int(upper_i)});
    result.push_back({int(upper_b->ibegin), int(upper_i), int(upper_b->ibegin), int(lower_i)});
    result.push_back({int(upper_b->iend), int(upper_i), int(upper_b->iend), int(lower_i)});
    result.push_back({int(upper_b->ibegin), int(lower_i), int(upper_b->iend), int(lower_i)});

    return result;
}